

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cc
# Opt level: O0

void __thiscall fasttext::Vector::addVector(Vector *this,Vector *source,real s)

{
  float fVar1;
  int64_t iVar2;
  int64_t iVar3;
  float *pfVar4;
  AlignedVector<float> *in_RSI;
  AlignedVector<float> *in_RDI;
  float in_XMM0_Da;
  int64_t i;
  size_t local_20;
  
  iVar2 = size((Vector *)0x15c4c3);
  iVar3 = size((Vector *)0x15c4d2);
  if (iVar2 == iVar3) {
    local_20 = 0;
    while( true ) {
      iVar2 = size((Vector *)0x15c51d);
      if (iVar2 <= (long)local_20) break;
      pfVar4 = intgemm::AlignedVector<float>::operator[](in_RSI,local_20);
      fVar1 = *pfVar4;
      pfVar4 = intgemm::AlignedVector<float>::operator[](in_RDI,local_20);
      *pfVar4 = in_XMM0_Da * fVar1 + *pfVar4;
      local_20 = local_20 + 1;
    }
    return;
  }
  __assert_fail("size() == source.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/olegtarasov[P]fastText/src/vector.cc"
                ,0x30,"void fasttext::Vector::addVector(const Vector &, real)");
}

Assistant:

void Vector::addVector(const Vector& source, real s) {
  assert(size() == source.size());
  for (int64_t i = 0; i < size(); i++) {
    data_[i] += s * source.data_[i];
  }
}